

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O3

void Eigen::internal::
     generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,8>
     ::scaleAndAddTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,
               Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *a_lhs,
               Matrix<double,__1,__1,_0,__1,__1> *a_rhs,Scalar *alpha)

{
  Scalar SVar1;
  BlockingType blocking;
  type lhs;
  gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false> local_98;
  Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_58;
  gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_1,_false,_double,_0,_false,_0>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false>_>
  local_50;
  
  local_98.super_level3_blocking<double,_double>.m_mc =
       (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  local_58.m_matrix = a_lhs->m_matrix;
  if ((local_98.super_level3_blocking<double,_double>.m_mc ==
       ((local_58.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
       m_storage.m_cols) &&
     (local_98.super_level3_blocking<double,_double>.m_nc =
           (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols,
     local_98.super_level3_blocking<double,_double>.m_nc ==
     (a_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols)) {
    if (((local_98.super_level3_blocking<double,_double>.m_nc != 0) &&
        (local_98.super_level3_blocking<double,_double>.m_mc != 0)) &&
       (local_98.super_level3_blocking<double,_double>.m_kc =
             ((local_58.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
             .m_storage.m_rows, local_98.super_level3_blocking<double,_double>.m_kc != 0)) {
      SVar1 = *alpha;
      local_98.super_level3_blocking<double,_double>.m_blockA = (LhsScalar *)0x0;
      local_98.super_level3_blocking<double,_double>.m_blockB = (RhsScalar *)0x0;
      evaluateProductBlockingSizesHeuristic<double,double,1,long>
                (&local_98.super_level3_blocking<double,_double>.m_kc,
                 &local_98.super_level3_blocking<double,_double>.m_mc,
                 &local_98.super_level3_blocking<double,_double>.m_nc,1);
      local_98.m_sizeA =
           local_98.super_level3_blocking<double,_double>.m_mc *
           local_98.super_level3_blocking<double,_double>.m_kc;
      local_98.m_sizeB =
           local_98.super_level3_blocking<double,_double>.m_kc *
           local_98.super_level3_blocking<double,_double>.m_nc;
      local_50.m_blocking = &local_98;
      local_50.m_lhs = &local_58;
      local_50.m_rhs = a_rhs;
      local_50.m_dest = dst;
      local_50.m_actualAlpha = SVar1;
      gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_1,_false,_double,_0,_false,_0>,_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_1,_false>_>
      ::operator()(&local_50,0,
                   (a_lhs->m_matrix->
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                   m_cols,0,(a_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                            ).m_storage.m_cols,(GemmParallelInfo<long> *)0x0);
      free(local_98.super_level3_blocking<double,_double>.m_blockA);
      free(local_98.super_level3_blocking<double,_double>.m_blockB);
    }
    return;
  }
  __assert_fail("dst.rows()==a_lhs.rows() && dst.cols()==a_rhs.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/products/GeneralMatrixMatrix.h"
                ,0x1cc,
                "static void Eigen::internal::generic_product_impl<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>, Eigen::DenseShape, Eigen::DenseShape, 8>::scaleAndAddTo(Dest &, const Lhs &, const Rhs &, const Scalar &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Rhs = Eigen::Matrix<double, -1, -1>, LhsShape = Eigen::DenseShape, RhsShape = Eigen::DenseShape, ProductType = 8, Dest = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

static void scaleAndAddTo(Dest& dst, const Lhs& a_lhs, const Rhs& a_rhs, const Scalar& alpha)
  {
    eigen_assert(dst.rows()==a_lhs.rows() && dst.cols()==a_rhs.cols());
    if(a_lhs.cols()==0 || a_lhs.rows()==0 || a_rhs.cols()==0)
      return;

    typename internal::add_const_on_value_type<ActualLhsType>::type lhs = LhsBlasTraits::extract(a_lhs);
    typename internal::add_const_on_value_type<ActualRhsType>::type rhs = RhsBlasTraits::extract(a_rhs);

    Scalar actualAlpha = alpha * LhsBlasTraits::extractScalarFactor(a_lhs)
                               * RhsBlasTraits::extractScalarFactor(a_rhs);

    typedef internal::gemm_blocking_space<(Dest::Flags&RowMajorBit) ? RowMajor : ColMajor,LhsScalar,RhsScalar,
            Dest::MaxRowsAtCompileTime,Dest::MaxColsAtCompileTime,MaxDepthAtCompileTime> BlockingType;

    typedef internal::gemm_functor<
      Scalar, Index,
      internal::general_matrix_matrix_product<
        Index,
        LhsScalar, (ActualLhsTypeCleaned::Flags&RowMajorBit) ? RowMajor : ColMajor, bool(LhsBlasTraits::NeedToConjugate),
        RhsScalar, (ActualRhsTypeCleaned::Flags&RowMajorBit) ? RowMajor : ColMajor, bool(RhsBlasTraits::NeedToConjugate),
        (Dest::Flags&RowMajorBit) ? RowMajor : ColMajor>,
      ActualLhsTypeCleaned, ActualRhsTypeCleaned, Dest, BlockingType> GemmFunctor;

    BlockingType blocking(dst.rows(), dst.cols(), lhs.cols(), 1, true);
    internal::parallelize_gemm<(Dest::MaxRowsAtCompileTime>32 || Dest::MaxRowsAtCompileTime==Dynamic)>
        (GemmFunctor(lhs, rhs, dst, actualAlpha, blocking), a_lhs.rows(), a_rhs.cols(), a_lhs.cols(), Dest::Flags&RowMajorBit);
  }